

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O2

VectorXd __thiscall ChebTools::ChebyshevExpansion::get_nodes_n11(ChebyshevExpansion *this)

{
  Index extraout_RDX;
  long in_RSI;
  VectorXd VVar1;
  double NN;
  Index N;
  longdouble local_248;
  Scalar local_230;
  double local_228;
  long local_220;
  long local_218 [2];
  double local_208;
  double dStack_200;
  Index local_1f8;
  double dStack_1f0;
  bool local_1e8;
  undefined7 uStack_1e7;
  RandomAccessLinSpacedReturnType local_1d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_1a0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_140;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>_>
  local_b8 [24];
  long local_a0;
  undefined8 uStack_98;
  double local_90;
  double dStack_88;
  Index local_80;
  double dStack_78;
  bool local_70;
  undefined7 uStack_6f;
  long lStack_68;
  double local_58;
  long local_48;
  double local_38;
  
  local_220 = *(long *)(in_RSI + 8) + -1;
  local_228 = (double)local_220;
  local_230 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::LinSpaced
            (&local_1d8,*(long *)(in_RSI + 8),&local_230,&local_228);
  local_1e8 = local_1d8.m_functor.impl.m_flip;
  uStack_1e7 = local_1d8.m_functor.impl._33_7_;
  local_1f8 = local_1d8.m_functor.impl.m_size1;
  dStack_1f0 = local_1d8.m_functor.impl.m_step;
  local_208 = local_1d8.m_functor.impl.m_low;
  dStack_200 = local_1d8.m_functor.impl.m_high;
  local_218[0] = local_1d8.m_rows.m_value;
  local_218[1] = local_1d8._8_8_;
  local_248 = _DAT_00135620;
  Eigen::
  ArrayBase<Eigen::ArrayWrapper<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>>const>>
  ::operator*(&local_1a0,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>>
               *)local_218,&local_248);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>>
  ::operator/(&local_140,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
               *)&local_1a0,&local_220);
  local_80 = local_140.m_lhs.m_lhs.m_expression.m_functor.impl.m_size1;
  dStack_78 = local_140.m_lhs.m_lhs.m_expression.m_functor.impl.m_step;
  local_90 = local_140.m_lhs.m_lhs.m_expression.m_functor.impl.m_low;
  dStack_88 = local_140.m_lhs.m_lhs.m_expression.m_functor.impl.m_high;
  local_a0 = local_140.m_lhs.m_lhs.m_expression.m_rows.m_value;
  uStack_98 = local_140.m_lhs.m_lhs.m_expression._8_8_;
  local_70 = local_140.m_lhs.m_lhs.m_expression.m_functor.impl.m_flip;
  uStack_6f = local_140.m_lhs.m_lhs.m_expression.m_functor.impl._33_7_;
  lStack_68 = local_140.m_lhs.m_rhs.m_rows.m_value;
  local_58 = local_140.m_lhs.m_rhs.m_functor.m_other;
  local_48 = local_140.m_rhs.m_rows.m_value;
  local_38 = local_140.m_rhs.m_functor.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,local_b8);
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd get_nodes_n11() const {
            Eigen::Index N = m_c.size() - 1;
            double NN = static_cast<double>(N);
            return (Eigen::VectorXd::LinSpaced(N + 1, 0, NN).array() * EIGEN_PI / N).cos();
        }